

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Drive.cpp
# Opt level: O2

void __thiscall Storage::Disk::Drive::end_writing(Drive *this)

{
  bool bVar1;
  PCMTrack *pPVar2;
  __shared_ptr<Storage::Disk::PCMTrack,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  if (this->is_reading_ == false) {
    this->is_reading_ = true;
    if ((this->patched_track_).
        super___shared_ptr<Storage::Disk::PCMTrack,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      std::dynamic_pointer_cast<Storage::Disk::PCMTrack,Storage::Disk::Track>
                ((shared_ptr<Storage::Disk::Track> *)&local_30);
      std::__shared_ptr<Storage::Disk::PCMTrack,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->patched_track_).
                  super___shared_ptr<Storage::Disk::PCMTrack,_(__gnu_cxx::_Lock_policy)2>,&local_30)
      ;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
      pPVar2 = (this->patched_track_).
               super___shared_ptr<Storage::Disk::PCMTrack,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((pPVar2 == (PCMTrack *)0x0) || (bVar1 = PCMTrack::is_resampled_clone(pPVar2), !bVar1)) {
        pPVar2 = PCMTrack::resampled_clone
                           ((this->track_).
                            super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,3200000);
        std::__shared_ptr<Storage::Disk::PCMTrack,_(__gnu_cxx::_Lock_policy)2>::
        reset<Storage::Disk::PCMTrack>
                  (&(this->patched_track_).
                    super___shared_ptr<Storage::Disk::PCMTrack,_(__gnu_cxx::_Lock_policy)2>,pPVar2);
      }
    }
    PCMTrack::add_segment
              ((this->patched_track_).
               super___shared_ptr<Storage::Disk::PCMTrack,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &this->write_start_time_,&this->write_segment_,this->clamp_writing_to_index_hole_);
    this->cycles_since_index_hole_ =
         this->cycles_since_index_hole_ % (long)this->cycles_per_revolution_;
    invalidate_track(this);
    return;
  }
  return;
}

Assistant:

void Drive::end_writing() {
	// If the user modifies a track, it's scaled up to a "high" resolution and modifications
	// are plotted on top of that.
	//
	// "High" is defined as: two samples per clock relative to an idiomatic
	// 8Mhz disk controller and 300RPM disk speed.
	const size_t high_resolution_track_rate = 3200000;

	if(!is_reading_) {
		is_reading_ = true;

		if(!patched_track_) {
			// Avoid creating a new patched track if this one is already patched
			patched_track_ = std::dynamic_pointer_cast<PCMTrack>(track_);
			if(!patched_track_ || !patched_track_->is_resampled_clone()) {
				Track *const tr = track_.get();
				patched_track_.reset(PCMTrack::resampled_clone(tr, high_resolution_track_rate));
			}
		}
		patched_track_->add_segment(write_start_time_, write_segment_, clamp_writing_to_index_hole_);
		cycles_since_index_hole_ %= cycles_per_revolution_;
		invalidate_track();
	}
}